

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.c
# Opt level: O2

char * try_fmt(char *src,int exp,char *fmt,char *typesrc,char type)

{
  int rd;
  int local_2c;
  
  local_2c = 0;
  __isoc99_sscanf(src,fmt,&local_2c);
  if (local_2c == exp) {
    *typesrc = type;
  }
  else {
    fmt = (char *)0x0;
  }
  return fmt;
}

Assistant:

static const char* try_fmt(const char* src, int exp, const char* fmt,
                           char* typesrc, char type)
{
    int rd = 0;
    sscanf(src, fmt, &rd);
    if(rd == exp)
    {
        *typesrc = type;
        return fmt;
    }
    else
        return NULL;
}